

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::RegisterTypeParameterizedTestSuite
               (char *test_suite_name,CodeLocation *code_location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TypeParameterizedTestSuiteRegistry *this;
  CodeLocation local_50;
  
  UnitTest::GetInstance();
  this = &(UnitTest::GetInstance::instance.impl_)->type_parameterized_test_registry_;
  paVar1 = &local_50.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_50.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  local_50.line = code_location->line;
  TypeParameterizedTestSuiteRegistry::RegisterTestSuite(this,test_suite_name,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.file._M_dataplus._M_p,local_50.file.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RegisterTypeParameterizedTestSuite(const char* test_suite_name,
                                        CodeLocation code_location) {
  GetUnitTestImpl()->type_parameterized_test_registry().RegisterTestSuite(
      test_suite_name, code_location);
}